

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

void duckdb::CSVMultiFileInfo::FinalizeCopyBind
               (ClientContext *context,BaseFileReaderOptions *options_p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *expected_names,vector<duckdb::LogicalType,_true> *expected_types)

{
  const_reference __k;
  mapped_type *pmVar1;
  size_type __n;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(options_p + 0x2e),
              &expected_names->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(options_p + 0x2b)
             ,&expected_types->
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  *(undefined1 *)&options_p[0x31]._vptr_BaseFileReaderOptions = 1;
  if ((expected_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (expected_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](expected_names,__n);
      pmVar1 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(options_p + 0x24),__k);
      *pmVar1 = __n;
      __n = __n + 1;
    } while (__n < (ulong)(((long)(expected_types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(expected_types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  return;
}

Assistant:

void CSVMultiFileInfo::FinalizeCopyBind(ClientContext &context, BaseFileReaderOptions &options_p,
                                        const vector<string> &expected_names,
                                        const vector<LogicalType> &expected_types) {
	auto &options = options_p.Cast<CSVFileReaderOptions>();
	auto &csv_options = options.options;
	csv_options.name_list = expected_names;
	csv_options.sql_type_list = expected_types;
	csv_options.columns_set = true;
	for (idx_t i = 0; i < expected_types.size(); i++) {
		csv_options.sql_types_per_column[expected_names[i]] = i;
	}
}